

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall rlottie::internal::renderer::Clipper::update(Clipper *this,VMatrix *matrix)

{
  int iVar1;
  VSize *in_RDI;
  VMatrix *m;
  VSize *this_00;
  VRectF local_20 [2];
  
  VPath::reset((VPath *)0x1608e1);
  this_00 = in_RDI + 1;
  iVar1 = VSize::width(in_RDI);
  m = (VMatrix *)(double)iVar1;
  iVar1 = VSize::height(in_RDI);
  VRectF::VRectF(local_20,0.0,0.0,(double)m,(double)iVar1);
  VPath::addRect((VPath *)this_00,(VRectF *)m,CCW);
  VPath::transform((VPath *)this_00,m);
  *(undefined1 *)&in_RDI[5].mw = 1;
  return;
}

Assistant:

void renderer::Clipper::update(const VMatrix &matrix)
{
    mPath.reset();
    mPath.addRect(VRectF(0, 0, mSize.width(), mSize.height()));
    mPath.transform(matrix);
    mRasterRequest = true;
}